

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_blob_detection.cpp
# Opt level: O2

bool blob_detection::Detect1Blob(void)

{
  uint uVar1;
  uint32_t y;
  uint32_t x;
  uchar value;
  uint32_t uVar2;
  vector<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_> *pvVar3;
  size_t sVar4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar5;
  long lVar6;
  uint uVar7;
  uint32_t roiHeight;
  uint32_t roiWidth;
  uint32_t local_12c;
  uint32_t local_128;
  uint local_124;
  uint32_t roiY;
  uint32_t roiX;
  BlobDetection detection;
  Image image;
  
  uVar7 = 0;
  do {
    local_12c = Test_Helper::runCount();
    if (local_12c <= uVar7) {
LAB_0012c8fd:
      return local_12c <= uVar7;
    }
    PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
              ((ImageTemplate<unsigned_char> *)&detection,0,0,'\x01','\x01');
    Unit_Test::blackImage(&image,(ImageTemplate<unsigned_char> *)&detection);
    local_124 = uVar7;
    PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
              ((ImageTemplate<unsigned_char> *)&detection);
    Unit_Test::generateRoi(&image,&roiX,&roiY,&roiWidth,&roiHeight);
    x = roiX;
    y = roiY;
    uVar2 = roiWidth;
    local_128 = roiHeight;
    value = Test_Helper::randomValue<unsigned_char>('\x01',0x100);
    Unit_Test::fillImage(&image,x,y,uVar2,local_128,value);
    detection._blob.
    super__Vector_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    detection._blob.
    super__Vector_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    detection._blob.
    super__Vector_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    Blob_Detection::BlobDetection::find
              (&detection,&image,(BlobParameters)ZEXT72144(ZEXT872(0) << 0x40),'\x01');
    uVar7 = local_124;
    uVar1 = (roiHeight + roiWidth) * 2 - 4;
    if (roiHeight < 3) {
      uVar1 = roiHeight * roiWidth;
    }
    if (roiWidth < 2) {
      uVar1 = roiHeight * roiWidth;
    }
    pvVar3 = Blob_Detection::BlobDetection::operator()(&detection);
    if ((long)(pvVar3->
              super__Vector_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>
              )._M_impl.super__Vector_impl_data._M_finish -
        (long)(pvVar3->
              super__Vector_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>
              )._M_impl.super__Vector_impl_data._M_start != 0x100) {
LAB_0012c8dc:
      std::vector<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>::~vector
                (&detection._blob);
      PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&image);
      goto LAB_0012c8fd;
    }
    pvVar3 = Blob_Detection::BlobDetection::operator()(&detection);
    uVar2 = Blob_Detection::BlobInfo::width
                      ((pvVar3->
                       super__Vector_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>
                       )._M_impl.super__Vector_impl_data._M_start);
    if (uVar2 != roiWidth) goto LAB_0012c8dc;
    pvVar3 = Blob_Detection::BlobDetection::operator()(&detection);
    uVar2 = Blob_Detection::BlobInfo::height
                      ((pvVar3->
                       super__Vector_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>
                       )._M_impl.super__Vector_impl_data._M_start);
    if (uVar2 != roiHeight) goto LAB_0012c8dc;
    pvVar3 = Blob_Detection::BlobDetection::operator()(&detection);
    sVar4 = Blob_Detection::BlobInfo::size
                      ((pvVar3->
                       super__Vector_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>
                       )._M_impl.super__Vector_impl_data._M_start);
    if (sVar4 != roiHeight * roiWidth) goto LAB_0012c8dc;
    pvVar3 = Blob_Detection::BlobDetection::operator()(&detection);
    pvVar5 = Blob_Detection::BlobInfo::contourX
                       ((pvVar3->
                        super__Vector_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>
                        )._M_impl.super__Vector_impl_data._M_start);
    lVar6 = (long)(pvVar5->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(pvVar5->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_start;
    if (lVar6 >> 2 != (ulong)uVar1) goto LAB_0012c8dc;
    pvVar3 = Blob_Detection::BlobDetection::operator()(&detection);
    pvVar5 = Blob_Detection::BlobInfo::edgeX
                       ((pvVar3->
                        super__Vector_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>
                        )._M_impl.super__Vector_impl_data._M_start);
    if ((long)(pvVar5->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(pvVar5->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_start != lVar6) goto LAB_0012c8dc;
    std::vector<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>::~vector
              ((vector<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_> *)
               &detection);
    PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&image);
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

bool Detect1Blob()
    {
        for( uint32_t i = 0; i < Unit_Test::runCount(); ++i ) {
            PenguinV_Image::Image image = Unit_Test::blackImage();

            uint32_t roiX, roiY;
            uint32_t roiWidth, roiHeight;
            Unit_Test::generateRoi( image, roiX, roiY, roiWidth, roiHeight );

            Unit_Test::fillImage( image, roiX, roiY, roiWidth, roiHeight, Unit_Test::randomValue<uint8_t>( 1, 256 ) );

            Blob_Detection::BlobDetection detection;
            detection.find( image );

            const uint32_t contour = ((roiWidth > 1) && (roiHeight > 2)) ? (2 * roiWidth + 2 * (roiHeight - 2)) : (roiWidth * roiHeight);

            if( detection().size() != 1 || detection()[0].width() != roiWidth ||
                detection()[0].height() != roiHeight || detection()[0].size() != roiWidth * roiHeight ||
                detection()[0].contourX().size() != contour ||
                detection()[0].edgeX   ().size() != contour )
                return false;
        }

        return true;
    }